

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

Fl_Type * __thiscall Fl_CodeBlock_Type::make(Fl_CodeBlock_Type *this)

{
  Fl_Type *p;
  int iVar1;
  Fl_CodeBlock_Type *this_00;
  Fl_Type **ppFVar2;
  
  ppFVar2 = &Fl_Type::current;
  while( true ) {
    p = *ppFVar2;
    if (p == (Fl_Type *)0x0) {
      fl_message("Please select a function");
      return (Fl_Type *)0x0;
    }
    iVar1 = (*p->_vptr_Fl_Type[0x23])(p);
    if (iVar1 != 0) break;
    ppFVar2 = &p->parent;
  }
  this_00 = (Fl_CodeBlock_Type *)operator_new(0x80);
  Fl_CodeBlock_Type(this_00);
  Fl_Type::name((Fl_Type *)this_00,"if (test())");
  this_00->after = (char *)0x0;
  Fl_Type::add((Fl_Type *)this_00,p);
  (this_00->super_Fl_Type).factory = &this->super_Fl_Type;
  return &this_00->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_CodeBlock_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_code_block()) p = p->parent;
  if (!p) {
    fl_message("Please select a function");
    return 0;
  }
  Fl_CodeBlock_Type *o = new Fl_CodeBlock_Type();
  o->name("if (test())");
  o->after = 0;
  o->add(p);
  o->factory = this;
  return o;
}